

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall
ImDrawList::AddText(ImDrawList *this,ImFont *font,float font_size,ImVec2 *pos,ImU32 col,
                   char *text_begin,char *text_end,float wrap_width,ImVec4 *cpu_fine_clip_rect)

{
  void *pvVar1;
  size_t sVar2;
  void **ppvVar3;
  ImVec4 *pIVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ImVec4 local_48;
  ImVec2 *local_38;
  
  if (0xffffff < col) {
    if (text_end == (char *)0x0) {
      sVar2 = strlen(text_begin);
      text_end = text_begin + sVar2;
    }
    if (text_end != text_begin) {
      if (font == (ImFont *)0x0) {
        font = this->_Data->Font;
      }
      if ((font_size == 0.0) && (!NAN(font_size))) {
        font_size = this->_Data->FontSize;
      }
      pvVar1 = font->ContainerAtlas->TexID;
      local_38 = pos;
      ppvVar3 = ImVector<void_*>::back(&this->_TextureIdStack);
      if (pvVar1 != *ppvVar3) {
        __assert_fail("font->ContainerAtlas->TexID == _TextureIdStack.back()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/w23[P]stameska/3p/imgui/imgui_draw.cpp"
                      ,0x4be,
                      "void ImDrawList::AddText(const ImFont *, float, const ImVec2 &, ImU32, const char *, const char *, float, const ImVec4 *)"
                     );
      }
      pIVar4 = ImVector<ImVec4>::back(&this->_ClipRectStack);
      local_48.x = pIVar4->x;
      local_48.y = pIVar4->y;
      local_48.z = pIVar4->z;
      local_48.w = pIVar4->w;
      if (cpu_fine_clip_rect != (ImVec4 *)0x0) {
        uVar5 = -(uint)(cpu_fine_clip_rect->x <= local_48.x);
        uVar6 = -(uint)(cpu_fine_clip_rect->y <= local_48.y);
        uVar7 = -(uint)(local_48.z < cpu_fine_clip_rect->z);
        uVar8 = -(uint)(local_48.w < cpu_fine_clip_rect->w);
        local_48.y = (float)(~uVar6 & (uint)cpu_fine_clip_rect->y | (uint)local_48.y & uVar6);
        local_48.x = (float)(~uVar5 & (uint)cpu_fine_clip_rect->x | (uint)local_48.x & uVar5);
        local_48.w = (float)(~uVar8 & (uint)cpu_fine_clip_rect->w | (uint)local_48.w & uVar8);
        local_48.z = (float)(~uVar7 & (uint)cpu_fine_clip_rect->z | (uint)local_48.z & uVar7);
      }
      ImFont::RenderText(font,this,font_size,*local_38,col,&local_48,text_begin,text_end,wrap_width,
                         cpu_fine_clip_rect != (ImVec4 *)0x0);
    }
  }
  return;
}

Assistant:

void ImDrawList::AddText(const ImFont* font, float font_size, const ImVec2& pos, ImU32 col, const char* text_begin, const char* text_end, float wrap_width, const ImVec4* cpu_fine_clip_rect)
{
    if ((col & IM_COL32_A_MASK) == 0)
        return;

    if (text_end == NULL)
        text_end = text_begin + strlen(text_begin);
    if (text_begin == text_end)
        return;

    // Pull default font/size from the shared ImDrawListSharedData instance
    if (font == NULL)
        font = _Data->Font;
    if (font_size == 0.0f)
        font_size = _Data->FontSize;

    IM_ASSERT(font->ContainerAtlas->TexID == _TextureIdStack.back());  // Use high-level ImGui::PushFont() or low-level ImDrawList::PushTextureId() to change font.

    ImVec4 clip_rect = _ClipRectStack.back();
    if (cpu_fine_clip_rect)
    {
        clip_rect.x = ImMax(clip_rect.x, cpu_fine_clip_rect->x);
        clip_rect.y = ImMax(clip_rect.y, cpu_fine_clip_rect->y);
        clip_rect.z = ImMin(clip_rect.z, cpu_fine_clip_rect->z);
        clip_rect.w = ImMin(clip_rect.w, cpu_fine_clip_rect->w);
    }
    font->RenderText(this, font_size, pos, col, clip_rect, text_begin, text_end, wrap_width, cpu_fine_clip_rect != NULL);
}